

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

int gauden_smooth_var(vector_t ***var,float32 **var_floor,uint32 n_mgau,uint32 n_stream,
                     uint32 n_density,uint32 *veclen)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  for (uVar5 = 0; uVar5 != n_stream; uVar5 = uVar5 + 1) {
    uVar3 = veclen[uVar5];
    for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
      fVar2 = (float)var_floor[uVar5][uVar6];
      for (uVar4 = 0; uVar4 != n_mgau; uVar4 = uVar4 + 1) {
        for (uVar7 = 0; n_density != uVar7; uVar7 = uVar7 + 1) {
          pfVar1 = var[uVar4][uVar5][uVar7] + uVar6;
          if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
            var[uVar4][uVar5][uVar7][uVar6] = fVar2;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int
gauden_smooth_var(vector_t ***var,
		  float32 **var_floor,
		  uint32 n_mgau,
		  uint32 n_stream,
		  uint32 n_density,
		  const uint32 *veclen)
{
    uint32 i, j, k, l;
    float32 flr;
    
    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {

	    flr = var_floor[j][l];

	    for (i = 0; i < n_mgau; i++) {
		for (k = 0; k < n_density; k++) {
		    if (var[i][j][k][l] < flr) var[i][j][k][l] = flr;
		}
	    }
	}
    }

    return S3_SUCCESS;
}